

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass.cpp
# Opt level: O0

Error __thiscall asmjit::_abi_1_10::BaseRAPass::updateStackFrame(BaseRAPass *this)

{
  bool bVar1;
  Error EVar2;
  uint32_t uVar3;
  FuncNode *this_00;
  BaseRAPass *in_RDI;
  BaseRAPass *in_stack_00000008;
  FuncFrame *in_stack_00000018;
  Error _err_5;
  Error _err_4;
  Error _err_3;
  Error _err_2;
  Error _err_1;
  Error _err;
  RegGroup group;
  Iterator __end2;
  Iterator __begin2;
  RegGroupVirtValues *__range2;
  FuncFrame *frame;
  RAStackAllocator *in_stack_000000c8;
  FuncFrame *in_stack_000002f0;
  FuncArgsAssignment *in_stack_000002f8;
  undefined4 in_stack_ffffffffffffff88;
  uint32_t in_stack_ffffffffffffff8c;
  FuncFrame *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  FuncFrame *this_01;
  FuncFrame *in_stack_ffffffffffffffa0;
  FuncFrame *in_stack_ffffffffffffffa8;
  int32_t offset;
  undefined6 in_stack_ffffffffffffffb0;
  RegGroup in_stack_ffffffffffffffb6;
  RegGroup in_stack_ffffffffffffffb7;
  Iterator local_23;
  Iterator local_22;
  EnumValues<asmjit::_abi_1_10::RegGroup,_(asmjit::_abi_1_10::RegGroup)0,_(asmjit::_abi_1_10::RegGroup)3>
  local_21;
  EnumValues<asmjit::_abi_1_10::RegGroup,_(asmjit::_abi_1_10::RegGroup)0,_(asmjit::_abi_1_10::RegGroup)3>
  *local_20;
  FuncFrame *local_18;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  this_00 = func(in_RDI);
  local_18 = FuncNode::frame(this_00);
  local_20 = &local_21;
  local_22 = Support::
             EnumValues<asmjit::_abi_1_10::RegGroup,_(asmjit::_abi_1_10::RegGroup)0,_(asmjit::_abi_1_10::RegGroup)3>
             ::begin(local_20);
  local_23 = Support::
             EnumValues<asmjit::_abi_1_10::RegGroup,_(asmjit::_abi_1_10::RegGroup)0,_(asmjit::_abi_1_10::RegGroup)3>
             ::end(local_20);
  while( true ) {
    offset = (int32_t)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
    bVar1 = Support::
            EnumValues<asmjit::_abi_1_10::RegGroup,_(asmjit::_abi_1_10::RegGroup)0,_(asmjit::_abi_1_10::RegGroup)3>
            ::Iterator::operator!=(&local_22,&local_23);
    if (!bVar1) break;
    in_stack_ffffffffffffffb6 =
         Support::
         EnumValues<asmjit::_abi_1_10::RegGroup,_(asmjit::_abi_1_10::RegGroup)0,_(asmjit::_abi_1_10::RegGroup)3>
         ::Iterator::operator*(&local_22);
    in_stack_ffffffffffffffa8 = local_18;
    in_stack_ffffffffffffffb7 = in_stack_ffffffffffffffb6;
    RARegMask::operator[]<asmjit::_abi_1_10::RegGroup>
              ((RARegMask *)in_stack_ffffffffffffff90,
               (RegGroup *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    FuncFrame::addDirtyRegs
              (in_stack_ffffffffffffffa0,(RegGroup)((ulong)in_stack_ffffffffffffff98 >> 0x38),
               (RegMask)in_stack_ffffffffffffff98);
    Support::
    EnumValues<asmjit::_abi_1_10::RegGroup,_(asmjit::_abi_1_10::RegGroup)0,_(asmjit::_abi_1_10::RegGroup)3>
    ::Iterator::operator++(&local_22);
  }
  RAStackAllocator::alignment(&in_RDI->_stackAllocator);
  FuncFrame::setLocalStackAlignment(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  if (((in_RDI->_numStackArgsToStackSlots == 0) ||
      (EVar2 = _markStackArgsToKeep
                         ((BaseRAPass *)
                          CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)), EVar2 == 0
      )) && (EVar2 = RAStackAllocator::calculateStackFrame(in_stack_000000c8), EVar2 == 0)) {
    this_01 = local_18;
    uVar3 = RAStackAllocator::stackSize(&in_RDI->_stackAllocator);
    FuncFrame::setLocalStackSize(this_01,uVar3);
    EVar2 = FuncArgsAssignment::updateFuncFrame(in_stack_000002f8,in_stack_000002f0);
    if ((EVar2 == 0) && (EVar2 = FuncFrame::finalize(in_stack_00000018), EVar2 == 0)) {
      uVar3 = FuncFrame::localStackOffset(local_18);
      if (uVar3 != 0) {
        FuncFrame::localStackOffset(local_18);
        EVar2 = RAStackAllocator::adjustSlotOffsets
                          ((RAStackAllocator *)
                           CONCAT17(in_stack_ffffffffffffffb7,
                                    CONCAT16(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0)),
                           offset);
        if (EVar2 != 0) {
          return EVar2;
        }
      }
      if ((in_RDI->_numStackArgsToStackSlots == 0) ||
         (EVar2 = _updateStackArgs(in_stack_00000008), EVar2 == 0)) {
        EVar2 = 0;
      }
    }
  }
  return EVar2;
}

Assistant:

Error BaseRAPass::updateStackFrame() noexcept {
  // Update some StackFrame information that we updated during allocation. The only information we don't have at the
  // moment is final local stack size, which is calculated last.
  FuncFrame& frame = func()->frame();
  for (RegGroup group : RegGroupVirtValues{})
    frame.addDirtyRegs(group, _clobberedRegs[group]);
  frame.setLocalStackAlignment(_stackAllocator.alignment());

  // If there are stack arguments that are not assigned to registers upon entry and the function doesn't require
  // dynamic stack alignment we keep these arguments where they are. This will also mark all stack slots that match
  // these arguments as allocated.
  if (_numStackArgsToStackSlots)
    ASMJIT_PROPAGATE(_markStackArgsToKeep());

  // Calculate offsets of all stack slots and update StackSize to reflect the calculated local stack size.
  ASMJIT_PROPAGATE(_stackAllocator.calculateStackFrame());
  frame.setLocalStackSize(_stackAllocator.stackSize());

  // Update the stack frame based on `_argsAssignment` and finalize it. Finalization means to apply final calculation
  // to the stack layout.
  ASMJIT_PROPAGATE(_argsAssignment.updateFuncFrame(frame));
  ASMJIT_PROPAGATE(frame.finalize());

  // StackAllocator allocates all stots starting from [0], adjust them when necessary.
  if (frame.localStackOffset() != 0)
    ASMJIT_PROPAGATE(_stackAllocator.adjustSlotOffsets(int32_t(frame.localStackOffset())));

  // Again, if there are stack arguments allocated in function's stack we have to handle them. This handles all cases
  // (either regular or dynamic stack alignment).
  if (_numStackArgsToStackSlots)
    ASMJIT_PROPAGATE(_updateStackArgs());

  return kErrorOk;
}